

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

void __thiscall fasttext::Autotune::train(Autotune *this,Args *autotuneArgs)

{
  int iVar1;
  int iVar2;
  AutotuneStrategy *__ptr;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  AutotuneStrategy *this_00;
  long *plVar12;
  Args *this_01;
  ostream *poVar13;
  invalid_argument *this_02;
  Autotune *pAVar14;
  runtime_error *this_03;
  char *pcVar15;
  pointer __p;
  double dVar16;
  ElapsedTimeMarker elapsedTimeMarker;
  Meter meter;
  Args bestTrainArgs;
  Args trainArgs;
  ifstream validationFileStream;
  double local_7c0;
  metric_name local_7a4;
  time_point local_7a0;
  string *local_798;
  string *local_790;
  string *local_788;
  string *local_780;
  string *local_778;
  string *local_770;
  undefined8 *local_768;
  bool *local_760;
  string *local_758;
  string *local_750;
  string *local_748;
  string *local_740;
  string local_738;
  undefined1 local_718 [64];
  size_type local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6d0;
  _Alloc_hider _Stack_6c0;
  size_type local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_6b0 [19];
  undefined1 local_578 [88];
  string local_520 [32];
  double local_500;
  int iStack_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int iStack_4e8;
  int iStack_4e4;
  int local_4e0;
  int iStack_4dc;
  loss_name lStack_4d8;
  model_name mStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int iStack_4c8;
  int iStack_4c4;
  double local_4c0;
  string local_4b8 [32];
  int local_498;
  string local_490 [32];
  undefined8 local_470 [6];
  string local_440 [32];
  string local_420 [40];
  string asStack_3f8 [32];
  Args local_3d8;
  istream local_238 [120];
  Autotune local_1c0 [6];
  
  std::ifstream::ifstream(local_238,(string *)&autotuneArgs->autotuneValidationFile,_S_in);
  pAVar14 = local_1c0;
  cVar10 = std::__basic_file<char>::is_open();
  if (cVar10 == '\0') {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_02,"Validation file cannot be opened!");
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  printSkippedArgs(pAVar14,autotuneArgs);
  iVar1 = autotuneArgs->verbose;
  Args::Args((Args *)local_578,autotuneArgs);
  Args::Args(&local_3d8,autotuneArgs);
  local_3d8.verbose = 0;
  this_00 = (AutotuneStrategy *)operator_new(0x1e0);
  AutotuneStrategy::AutotuneStrategy(this_00,&local_3d8,(long)autotuneArgs->seed);
  local_718._0_8_ = (AutotuneStrategy *)0x0;
  __ptr = (this->strategy_)._M_t.
          super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
          ._M_t.
          super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
          .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl;
  (this->strategy_)._M_t.
  super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
  .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl = this_00;
  if ((__ptr != (AutotuneStrategy *)0x0) &&
     (std::default_delete<fasttext::AutotuneStrategy>::operator()
                ((default_delete<fasttext::AutotuneStrategy> *)&this->strategy_,__ptr),
     (AutotuneStrategy *)local_718._0_8_ != (AutotuneStrategy *)0x0)) {
    std::default_delete<fasttext::AutotuneStrategy>::operator()
              ((default_delete<fasttext::AutotuneStrategy> *)local_718,
               (AutotuneStrategy *)local_718._0_8_);
  }
  startTimer(this,autotuneArgs);
  bVar9 = false;
  if ((((this->continueTraining_)._M_base._M_i & 1U) != 0) &&
     (dVar16 = this->elapsed_, dVar16 < (double)autotuneArgs->autotuneDuration)) {
    local_748 = local_4b8;
    local_740 = &local_3d8.label;
    local_758 = local_490;
    local_750 = &local_3d8.pretrainedVectors;
    local_768 = local_470;
    local_760 = &local_3d8.saveOutput;
    local_778 = local_440;
    local_770 = &local_3d8.autotuneValidationFile;
    local_788 = local_420;
    local_780 = &local_3d8.autotuneMetric;
    local_798 = asStack_3f8;
    local_790 = &local_3d8.autotuneModelSize;
    bVar9 = false;
    do {
      this->trials_ = this->trials_ + 1;
      AutotuneStrategy::ask
                ((Args *)local_718,
                 (this->strategy_)._M_t.
                 super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
                 .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl,dVar16);
      Args::operator=(&local_3d8,(Args *)local_718);
      this_01 = (Args *)local_718;
      Args::~Args((Args *)local_718);
      if (2 < autotuneArgs->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Trial = ",8);
        plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->trials_);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        this_01 = (Args *)std::ostream::put((char)plVar12);
        std::ostream::flush();
      }
      printArgs((Autotune *)this_01,&local_3d8,autotuneArgs);
      local_7a0.__d.__r = (duration)0;
      local_7a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      FastText::train((this->fastText_).
                      super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &local_3d8);
      bVar11 = quantize(this,&local_3d8,autotuneArgs);
      if (bVar11) {
        local_718._32_8_ = 0;
        local_718._40_8_ = 0;
        local_718._48_8_ = (__node_base_ptr)0x0;
        local_718._0_8_ = (AutotuneStrategy *)0x0;
        local_718._8_8_ = 0;
        local_718._16_8_ = (_Hash_node_base *)0x0;
        local_718._24_8_ = (void *)0x0;
        local_718._56_8_ = aaStack_6b0;
        local_6d8 = 1;
        aStack_6d0._M_allocated_capacity = 0;
        aStack_6d0._8_8_ = 0;
        _Stack_6c0._M_p = (pointer)0x3f800000;
        local_6b8 = 0;
        aaStack_6b0[0]._M_allocated_capacity = 0;
        FastText::test((this->fastText_).
                       super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_238,autotuneArgs->autotunePredictions,0.0,(Meter *)local_718);
        local_7a4 = Args::getAutotuneMetric(autotuneArgs);
        Args::getAutotuneMetricLabel_abi_cxx11_(&local_738,autotuneArgs);
        local_7c0 = getMetricScore(this,(Meter *)local_718,&local_7a4,&local_738);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p);
        }
        dVar16 = this->bestScore_;
        if (((dVar16 == -1.0) && (!NAN(dVar16))) || (dVar16 < local_7c0)) {
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_578,
                     (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&local_3d8);
          std::__cxx11::string::_M_assign((string *)(local_578 + 0x38));
          std::__cxx11::string::_M_assign(local_520);
          local_4c0 = local_3d8.t;
          local_4e0 = local_3d8.neg;
          iStack_4dc = local_3d8.wordNgrams;
          lStack_4d8 = local_3d8.loss;
          mStack_4d4 = local_3d8.model;
          iStack_4d0 = local_3d8.bucket;
          iStack_4cc = local_3d8.minn;
          iStack_4c8 = local_3d8.maxn;
          iStack_4c4 = local_3d8.thread;
          local_500 = local_3d8.lr;
          iStack_4f8 = local_3d8.lrUpdateRate;
          iStack_4f4 = local_3d8.dim;
          iStack_4f0 = local_3d8.ws;
          iStack_4ec = local_3d8.epoch;
          iStack_4e8 = local_3d8.minCount;
          iStack_4e4 = local_3d8.minCountLabel;
          std::__cxx11::string::_M_assign(local_748);
          local_498 = local_3d8.verbose;
          std::__cxx11::string::_M_assign(local_758);
          uVar3 = *(undefined8 *)local_760;
          uVar4 = *(undefined8 *)(local_760 + 8);
          sVar5 = *(size_t *)(local_760 + 0x10);
          sVar6 = *(size_t *)(local_760 + 0x18);
          sVar7 = *(size_t *)(local_760 + 0x18);
          uVar8 = *(undefined8 *)(local_760 + 0x20);
          dVar16 = *(double *)(local_760 + 0x28);
          local_768[2] = *(size_t *)(local_760 + 0x10);
          local_768[3] = sVar7;
          local_768[4] = uVar8;
          local_768[5] = dVar16;
          *local_768 = uVar3;
          local_768[1] = uVar4;
          local_768[2] = sVar5;
          local_768[3] = sVar6;
          std::__cxx11::string::_M_assign(local_778);
          std::__cxx11::string::_M_assign(local_788);
          local_420._32_8_ = local_3d8._376_8_;
          std::__cxx11::string::_M_assign(local_798);
          this->bestScore_ = local_7c0;
          AutotuneStrategy::updateBest
                    ((this->strategy_)._M_t.
                     super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
                     .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl,
                     (Args *)local_578);
        }
        std::
        _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(local_718 + 0x38));
        if ((void *)local_718._24_8_ != (void *)0x0) {
          operator_delete((void *)local_718._24_8_);
        }
      }
      else {
        iVar2 = this->sizeConstraintFailed_;
        this->sizeConstraintFailed_ = iVar2 + 1;
        if (bVar9) {
          local_7c0 = NAN;
        }
        else {
          local_7c0 = NAN;
          if ((int)((uint)this->trials_ >> 1) <= iVar2 && 10 < this->trials_) {
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
            std::ostream::put('H');
            poVar13 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,
                       "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
                       ,100);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
            std::ostream::put((char)poVar13);
            bVar9 = true;
            std::ostream::flush();
            local_7c0 = NAN;
          }
        }
      }
      if (2 < autotuneArgs->verbose) {
        if (NAN(local_7c0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"currentScore = NaN",0x12);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          poVar13 = (ostream *)&std::cout;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"currentScore = ",0xf);
          poVar13 = std::ostream::_M_insert<double>(local_7c0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        }
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if (2 < autotuneArgs->verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"train took = ",0xd);
          local_718._0_8_ = std::chrono::_V2::steady_clock::now();
          dVar16 = utils::getDuration(&local_7a0,(time_point *)local_718);
          poVar13 = std::ostream::_M_insert<double>(dVar16);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
      }
    } while ((((this->continueTraining_)._M_base._M_i & 1U) != 0) &&
            (dVar16 = this->elapsed_, dVar16 < (double)autotuneArgs->autotuneDuration));
  }
  if ((this->timer_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->bestScore_ == -1.0) && (!NAN(this->bestScore_))) {
    local_718._0_8_ = local_718 + 0x10;
    local_718._8_8_ = 0;
    local_718._16_8_ = local_718._16_8_ & 0xffffffffffffff00;
    pcVar15 = "Didn\'t have enough time to train once: please increase `autotune-duration`.";
    if (bVar9) {
      pcVar15 = "Couldn\'t fulfil model size constraint: please increase `autotune-modelsize`.";
    }
    std::__cxx11::string::operator=((string *)local_718,pcVar15);
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_03,(string *)local_718);
    __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Training again with best arguments",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  pAVar14 = (Autotune *)std::ostream::put('H');
  std::ostream::flush();
  local_498 = iVar1;
  if (2 < autotuneArgs->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Best selected args = ",0x15);
    plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    pAVar14 = (Autotune *)std::ostream::put((char)plVar12);
    std::ostream::flush();
  }
  printArgs(pAVar14,(Args *)local_578,autotuneArgs);
  FastText::train((this->fastText_).
                  super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  (Args *)local_578);
  quantize(this,(Args *)local_578,autotuneArgs);
  Args::~Args(&local_3d8);
  Args::~Args((Args *)local_578);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Autotune::train(const Args& autotuneArgs) {
  std::ifstream validationFileStream(autotuneArgs.autotuneValidationFile);
  if (!validationFileStream.is_open()) {
    throw std::invalid_argument("Validation file cannot be opened!");
  }
  printSkippedArgs(autotuneArgs);

  bool sizeConstraintWarning = false;
  int verbose = autotuneArgs.verbose;
  Args bestTrainArgs(autotuneArgs);
  Args trainArgs(autotuneArgs);
  trainArgs.verbose = 0;
  strategy_ = std::unique_ptr<AutotuneStrategy>(
      new AutotuneStrategy(trainArgs, autotuneArgs.seed));
  startTimer(autotuneArgs);

  while (keepTraining(autotuneArgs.autotuneDuration)) {
    trials_++;

    trainArgs = strategy_->ask(elapsed_);
    LOG_VAL(Trial, trials_)
    printArgs(trainArgs, autotuneArgs);
    ElapsedTimeMarker elapsedTimeMarker;
    double currentScore = std::numeric_limits<double>::quiet_NaN();
    try {
      fastText_->train(trainArgs);
      bool sizeConstraintOK = quantize(trainArgs, autotuneArgs);
      if (sizeConstraintOK) {
        Meter meter;
        fastText_->test(
            validationFileStream, autotuneArgs.autotunePredictions, 0.0, meter);

        currentScore = getMetricScore(
            meter,
            autotuneArgs.getAutotuneMetric(),
            autotuneArgs.getAutotuneMetricLabel());

        if (bestScore_ == kUnknownBestScore ||
            (currentScore > bestScore_)) {
          bestTrainArgs = trainArgs;
          bestScore_ = currentScore;
          strategy_->updateBest(bestTrainArgs);
        }
      } else {
        sizeConstraintFailed_++;
        if (!sizeConstraintWarning && trials_ > 10 &&
            sizeConstraintFailed_ > (trials_ / 2)) {
          sizeConstraintWarning = true;
          std::cerr
              << std::endl
              << "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
              << std::endl;
        }
      }
    } catch (DenseMatrix::EncounteredNaNError&) {
      // ignore diverging loss and go on
    } catch (std::bad_alloc&) {
      // ignore parameter samples asking too much memory
    } catch (TimeoutError&) {
      break;
    } catch (FastText::AbortError&) {
      break;
    }
    LOG_VAL_NAN(currentScore, currentScore)
    LOG_VAL(train took, elapsedTimeMarker.getElapsed())
  }
  if (timer_.joinable()) {
    timer_.join();
  }

  if (bestScore_ == kUnknownBestScore) {
    std::string errorMessage;
    if (sizeConstraintWarning) {
      errorMessage =
          "Couldn't fulfil model size constraint: please increase `autotune-modelsize`.";
    } else {
      errorMessage =
          "Didn't have enough time to train once: please increase `autotune-duration`.";
    }
    throw std::runtime_error(errorMessage);
  } else {
    std::cerr << std::endl;
    std::cerr << "Training again with best arguments" << std::endl;
    bestTrainArgs.verbose = verbose;
    LOG_VAL(Best selected args, 0)
    printArgs(bestTrainArgs, autotuneArgs);
    fastText_->train(bestTrainArgs);
    quantize(bestTrainArgs, autotuneArgs);
  }
}